

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

int png_text_compress(png_structrp png_ptr,png_uint_32 chunk_name,compression_state *comp,
                     png_uint_32 prefix_len)

{
  uInt uVar1;
  int ret;
  ulong uVar2;
  png_compression_bufferp ppVar3;
  png_alloc_size_t pVar4;
  png_compression_bufferp ppVar5;
  int iVar6;
  png_uint_32 pVar7;
  
  ret = png_deflate_claim(png_ptr,chunk_name,comp->input_len);
  if (ret == 0) {
    pVar4 = comp->input_len;
    (png_ptr->zstream).next_in = comp->input;
    (png_ptr->zstream).next_out = comp->output;
    (png_ptr->zstream).avail_out = 0x400;
    iVar6 = 0x400;
    ppVar5 = (png_compression_bufferp)&png_ptr->zbuffer_list;
    do {
      uVar2 = 0xffffffff;
      if (pVar4 < 0xffffffff) {
        uVar2 = pVar4;
      }
      pVar4 = pVar4 - uVar2;
      (png_ptr->zstream).avail_in = (uint32_t)uVar2;
      ppVar3 = ppVar5;
      if ((png_ptr->zstream).avail_out == 0) {
        if ((int)(iVar6 + prefix_len) < 0) {
LAB_0011e78f:
          ret = -4;
          break;
        }
        ppVar3 = ppVar5->next;
        if (ppVar3 == (png_compression_bufferp)0x0) {
          ppVar3 = (png_compression_bufferp)
                   png_malloc_base(png_ptr,(ulong)png_ptr->zbuffer_size + 8);
          if (ppVar3 == (png_compression_bufferp)0x0) goto LAB_0011e78f;
          ppVar3->next = (png_compression_bufferp)0x0;
          ppVar5->next = ppVar3;
        }
        (png_ptr->zstream).next_out = ppVar3->output;
        uVar1 = png_ptr->zbuffer_size;
        (png_ptr->zstream).avail_out = uVar1;
        iVar6 = iVar6 + uVar1;
      }
      ret = deflate(&png_ptr->zstream,(uint)(pVar4 == 0) << 2);
      pVar4 = (png_ptr->zstream).avail_in + pVar4;
      (png_ptr->zstream).avail_in = 0;
      ppVar5 = ppVar3;
    } while (ret == 0);
    pVar7 = iVar6 - (png_ptr->zstream).avail_out;
    (png_ptr->zstream).avail_out = 0;
    comp->output_len = pVar7;
    if (pVar7 + prefix_len < 0x7fffffff) {
      png_zstream_error(png_ptr,ret);
    }
    else {
      (png_ptr->zstream).msg = "compressed data too long";
      ret = -4;
    }
    png_ptr->zowner = 0;
    if ((ret == 1) && (pVar4 == 0)) {
      optimize_cmf(comp->output,comp->input_len);
      ret = 0;
    }
  }
  return ret;
}

Assistant:

static int
png_text_compress(png_structrp png_ptr, png_uint_32 chunk_name,
    compression_state *comp, png_uint_32 prefix_len)
{
   int ret;

   /* To find the length of the output it is necessary to first compress the
    * input. The result is buffered rather than using the two-pass algorithm
    * that is used on the inflate side; deflate is assumed to be slower and a
    * PNG writer is assumed to have more memory available than a PNG reader.
    *
    * IMPLEMENTATION NOTE: the zlib API deflateBound() can be used to find an
    * upper limit on the output size, but it is always bigger than the input
    * size so it is likely to be more efficient to use this linked-list
    * approach.
    */
   ret = png_deflate_claim(png_ptr, chunk_name, comp->input_len);

   if (ret != Z_OK)
      return ret;

   /* Set up the compression buffers, we need a loop here to avoid overflowing a
    * uInt.  Use ZLIB_IO_MAX to limit the input.  The output is always limited
    * by the output buffer size, so there is no need to check that.  Since this
    * is ANSI-C we know that an 'int', hence a uInt, is always at least 16 bits
    * in size.
    */
   {
      png_compression_bufferp *end = &png_ptr->zbuffer_list;
      png_alloc_size_t input_len = comp->input_len; /* may be zero! */
      png_uint_32 output_len;

      /* zlib updates these for us: */
      png_ptr->zstream.next_in = PNGZ_INPUT_CAST(comp->input);
      png_ptr->zstream.avail_in = 0; /* Set below */
      png_ptr->zstream.next_out = comp->output;
      png_ptr->zstream.avail_out = (sizeof comp->output);

      output_len = png_ptr->zstream.avail_out;

      do
      {
         uInt avail_in = ZLIB_IO_MAX;

         if (avail_in > input_len)
            avail_in = (uInt)input_len;

         input_len -= avail_in;

         png_ptr->zstream.avail_in = avail_in;

         if (png_ptr->zstream.avail_out == 0)
         {
            png_compression_buffer *next;

            /* Chunk data is limited to 2^31 bytes in length, so the prefix
             * length must be counted here.
             */
            if (output_len + prefix_len > PNG_UINT_31_MAX)
            {
               ret = Z_MEM_ERROR;
               break;
            }

            /* Need a new (malloc'ed) buffer, but there may be one present
             * already.
             */
            next = *end;
            if (next == NULL)
            {
               next = png_voidcast(png_compression_bufferp, png_malloc_base
                  (png_ptr, PNG_COMPRESSION_BUFFER_SIZE(png_ptr)));

               if (next == NULL)
               {
                  ret = Z_MEM_ERROR;
                  break;
               }

               /* Link in this buffer (so that it will be freed later) */
               next->next = NULL;
               *end = next;
            }

            png_ptr->zstream.next_out = next->output;
            png_ptr->zstream.avail_out = png_ptr->zbuffer_size;
            output_len += png_ptr->zstream.avail_out;

            /* Move 'end' to the next buffer pointer. */
            end = &next->next;
         }

         /* Compress the data */
         ret = deflate(&png_ptr->zstream,
             input_len > 0 ? Z_NO_FLUSH : Z_FINISH);

         /* Claw back input data that was not consumed (because avail_in is
          * reset above every time round the loop).
          */
         input_len += png_ptr->zstream.avail_in;
         png_ptr->zstream.avail_in = 0; /* safety */
      }
      while (ret == Z_OK);

      /* There may be some space left in the last output buffer. This needs to
       * be subtracted from output_len.
       */
      output_len -= png_ptr->zstream.avail_out;
      png_ptr->zstream.avail_out = 0; /* safety */
      comp->output_len = output_len;

      /* Now double check the output length, put in a custom message if it is
       * too long.  Otherwise ensure the z_stream::msg pointer is set to
       * something.
       */
      if (output_len + prefix_len >= PNG_UINT_31_MAX)
      {
         png_ptr->zstream.msg = PNGZ_MSG_CAST("compressed data too long");
         ret = Z_MEM_ERROR;
      }

      else
         png_zstream_error(png_ptr, ret);

      /* Reset zlib for another zTXt/iTXt or image data */
      png_ptr->zowner = 0;

      /* The only success case is Z_STREAM_END, input_len must be 0; if not this
       * is an internal error.
       */
      if (ret == Z_STREAM_END && input_len == 0)
      {
#ifdef PNG_WRITE_OPTIMIZE_CMF_SUPPORTED
         /* Fix up the deflate header, if required */
         optimize_cmf(comp->output, comp->input_len);
#endif
         /* But Z_OK is returned, not Z_STREAM_END; this allows the claim
          * function above to return Z_STREAM_END on an error (though it never
          * does in the current versions of zlib.)
          */
         return Z_OK;
      }

      else
         return ret;
   }
}